

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr_quadratic.h
# Opt level: O3

void __thiscall mp::QuadTerms::QuadTerms(QuadTerms *this,QuadTerms *param_1)

{
  gch::detail::small_vector_base<std::allocator<std::pair<std::pair<int,int>,double>>,8u>::
  small_vector_base<8u>();
  gch::detail::small_vector_base<std::allocator<double>,6u>::small_vector_base<6u>
            ((small_vector_base<std::allocator<double>,6u> *)&this->coefs_aux_,&param_1->coefs_aux_)
  ;
  gch::detail::small_vector_base<std::allocator<int>,6u>::small_vector_base<6u>
            ((small_vector_base<std::allocator<int>,6u> *)&this->vars1_aux_,&param_1->vars1_aux_);
  gch::detail::small_vector_base<std::allocator<int>,6u>::small_vector_base<6u>
            ((small_vector_base<std::allocator<int>,6u> *)&this->vars2_aux_,&param_1->vars2_aux_);
  return;
}

Assistant:

static constexpr const char* GetTypeName() { return "QuadTerms"; }